

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_generic_iterator_t xcb_input_device_enable_state_end(xcb_input_device_enable_state_iterator_t i)

{
  void *pvVar1;
  xcb_generic_iterator_t xVar2;
  long lVar3;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  xcb_generic_iterator_t ret;
  undefined4 local_28;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  local_20 = (int)in_RSI;
  pvVar1 = (void *)(in_RDI + (long)local_20 * 8);
  local_28 = (int)in_RDI;
  uStack_1c = (int)((ulong)in_RSI >> 0x20);
  local_18 = (int)pvVar1;
  lVar3 = (ulong)(uint)(uStack_1c + (local_18 - local_28)) << 0x20;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    xVar2.rem = (int)lVar3;
    xVar2.index = (int)((ulong)lVar3 >> 0x20);
    xVar2.data = pvVar1;
    return xVar2;
  }
  __stack_chk_fail();
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_enable_state_end (xcb_input_device_enable_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    ret.data = i.data + i.rem;
    ret.index = i.index + ((char *) ret.data - (char *) i.data);
    ret.rem = 0;
    return ret;
}